

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  longlong lVar5;
  longlong lVar6;
  TrackPosition *pTVar7;
  TrackPosition *pTVar8;
  TrackPosition *pTVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long len;
  TrackPosition *tp;
  long local_58;
  TrackPosition *local_50;
  long local_48;
  long local_40;
  longlong local_38;
  
  lVar2 = this->m_timecode;
  bVar4 = true;
  if (lVar2 < 0) {
    if (this->m_track_positions != (TrackPosition *)0x0) {
      __assert_fail("m_track_positions == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8e7,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    if (this->m_track_positions_count != 0) {
      __assert_fail("m_track_positions_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8e8,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    lVar5 = ReadID(pReader,-lVar2,&local_58);
    if (lVar5 == 0xbb) {
      lVar12 = local_58 - lVar2;
      local_38 = ReadUInt(pReader,lVar12,&local_58);
      if (local_38 < 0) {
        __assert_fail("size >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x8f9,"bool mkvparser::CuePoint::Load(IMkvReader *)");
      }
      if (local_38 == 0) {
        this->m_track_positions_count = 0;
      }
      else {
        lVar12 = lVar12 + local_58;
        lVar1 = local_38 + lVar12;
        local_50 = (TrackPosition *)0x0;
        local_48 = -lVar2;
        local_40 = lVar12;
        do {
          lVar5 = ReadID(pReader,lVar12,&local_58);
          if ((((lVar5 < 0) || (lVar12 = lVar12 + local_58, lVar1 < lVar12)) ||
              (lVar6 = ReadUInt(pReader,lVar12,&local_58), lVar6 < 0)) ||
             ((lVar10 = lVar12 + local_58, lVar1 < lVar10 ||
              (lVar12 = lVar10 + lVar6, lVar1 < lVar12)))) goto LAB_0011237b;
          if (lVar5 == 0xb7) {
            local_50 = (TrackPosition *)((long)&local_50->m_track + 1);
            if ((ulong)local_50 >> 0x20 != 0) {
              return true;
            }
          }
          else if (lVar5 == 0xb3) {
            lVar5 = UnserializeUInt(pReader,lVar10,lVar6);
            this->m_timecode = lVar5;
          }
          pTVar9 = local_50;
        } while (lVar12 < lVar1);
        this->m_track_positions_count = (size_t)local_50;
        if (local_50 != (TrackPosition *)0x0 && -1 < this->m_timecode) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_50;
          uVar11 = 0xffffffffffffffff;
          if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
            uVar11 = SUB168(auVar3 * ZEXT816(0x18),0);
          }
          pTVar7 = (TrackPosition *)operator_new__(uVar11,(nothrow_t *)&std::nothrow);
          this->m_track_positions = pTVar7;
          if (pTVar7 != (TrackPosition *)0x0) {
            pTVar8 = pTVar7;
            lVar12 = local_40;
            if (local_38 != 0) {
              do {
                local_50 = pTVar7;
                lVar5 = ReadID(pReader,lVar12,&local_58);
                if ((lVar5 < 0) || (lVar12 = lVar12 + local_58, lVar1 < lVar12)) goto LAB_0011237b;
                lVar6 = ReadUInt(pReader,lVar12,&local_58);
                if (lVar6 < 0) {
                  __assert_fail("size >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0x944,"bool mkvparser::CuePoint::Load(IMkvReader *)");
                }
                lVar10 = lVar12 + local_58;
                if (lVar1 < lVar10) {
                  __assert_fail("(pos + len) <= stop",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0x945,"bool mkvparser::CuePoint::Load(IMkvReader *)");
                }
                lVar12 = lVar10 + lVar6;
                if (lVar1 < lVar12) {
                  __assert_fail("(pos + size) <= stop",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0x948,"bool mkvparser::CuePoint::Load(IMkvReader *)");
                }
                if (lVar5 == 0xb7) {
                  bVar4 = TrackPosition::Parse(local_50,pReader,lVar10,lVar6);
                  if (!bVar4) goto LAB_0011237b;
                  local_50 = local_50 + 1;
                }
                pTVar7 = local_50;
              } while (lVar12 < lVar1);
              pTVar9 = (TrackPosition *)this->m_track_positions_count;
              pTVar8 = this->m_track_positions;
            }
            if (((long)pTVar7 - (long)pTVar8 >> 3) * -0x5555555555555555 - (long)pTVar9 == 0) {
              this->m_element_start = local_48;
              this->m_element_size = lVar2 + lVar1;
              return true;
            }
            __assert_fail("size_t(p - m_track_positions) == m_track_positions_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x956,"bool mkvparser::CuePoint::Load(IMkvReader *)");
          }
        }
      }
    }
LAB_0011237b:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions
  unsigned long long track_positions_count = 0;
  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions) {
      ++track_positions_count;
      if (track_positions_count > UINT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
  }

  m_track_positions_count = static_cast<size_t>(track_positions_count);

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}